

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlACatalogResolvePublic(xmlCatalogPtr catal,xmlChar *pubID)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlChar *pxVar4;
  
  if (catal != (xmlCatalogPtr)0x0 && pubID != (xmlChar *)0x0) {
    if (xmlDebugCatalogs != 0) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Resolve pubID %s\n",pubID);
    }
    if (catal->type == XML_XML_CATALOG_TYPE) {
      pxVar4 = xmlCatalogListXMLResolve(catal->xml,pubID,(xmlChar *)0x0);
      if (pxVar4 != (xmlChar *)0xffffffffffffffff) {
        return pxVar4;
      }
      return (xmlChar *)0x0;
    }
    pxVar4 = xmlCatalogGetSGMLPublic(catal->sgml,pubID);
    if (pxVar4 != (xmlChar *)0x0) {
      pxVar4 = xmlStrdup(pxVar4);
      return pxVar4;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlACatalogResolvePublic(xmlCatalogPtr catal, const xmlChar *pubID) {
    xmlChar *ret = NULL;

    if ((pubID == NULL) || (catal == NULL))
	return(NULL);

    if (xmlDebugCatalogs)
	xmlGenericError(xmlGenericErrorContext,
		"Resolve pubID %s\n", pubID);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	ret = xmlCatalogListXMLResolve(catal->xml, pubID, NULL);
	if (ret == XML_CATAL_BREAK)
	    ret = NULL;
    } else {
	const xmlChar *sgml;

	sgml = xmlCatalogGetSGMLPublic(catal->sgml, pubID);
	if (sgml != NULL)
	    ret = xmlStrdup(sgml);
    }
    return(ret);
}